

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTimer.h
# Opt level: O0

void __thiscall HTimer::report(HTimer *this,int itemCount,int *itemList)

{
  undefined8 uVar1;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  double dVar2;
  int percent;
  int i_1;
  int i;
  double totalTick;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  int local_24;
  
  dVar2 = getTick((HTimer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  printf("profile-name ");
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    uVar1 = std::__cxx11::string::c_str();
    printf(" %s",uVar1);
  }
  printf("\n");
  printf("profile-item ");
  for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
    printf(" %3d",(ulong)(uint)(int)((*(double *)
                                       (in_RDI + 0xe0 +
                                       (long)*(int *)(in_RDX + (long)local_28 * 4) * 8) * 1000.0) /
                                    dVar2));
  }
  printf("\n");
  return;
}

Assistant:

void report(int itemCount, int *itemList) {
        double totalTick = getTick();
        printf("profile-name ");
        for (int i = 0; i < itemCount; i++)
            printf(" %s", itemNames[itemList[i]].c_str());
        printf("\n");
        printf("profile-item ");
        for (int i = 0; i < itemCount; i++) {
            int percent = 1000.0 * itemTicks[itemList[i]] / totalTick;
            printf(" %3d", percent);
        }
        printf("\n");
    }